

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

bool __thiscall
VmaDefragmentationContext_T::MoveDataToFreeBlocks
          (VmaDefragmentationContext_T *this,VmaSuballocationType currentType,VmaBlockVector *vector
          ,size_t firstFreeBlock,bool *texturePresent,bool *bufferPresent,bool *otherPresent)

{
  size_t sVar1;
  VmaBlockMetadata *pVVar2;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  VmaSuballocationType VVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool *pbVar9;
  undefined4 extraout_var_01;
  size_t sVar10;
  VmaSuballocationType VVar11;
  ulong uVar12;
  VmaAllocationCreateFlags VVar13;
  size_t sVar14;
  MoveAllocationData moveData;
  MoveAllocationData local_60;
  long lVar8;
  
  sVar1 = (this->m_Moves).m_Count;
  sVar10 = sVar1;
  sVar14 = firstFreeBlock;
  if (firstFreeBlock != 0) {
    do {
      pVVar2 = (vector->m_Blocks).m_pArray[sVar14 - 1]->m_pMetadata;
      iVar6 = (*pVVar2->_vptr_VmaBlockMetadata[0xb])(pVVar2);
      lVar8 = CONCAT44(extraout_var,iVar6);
      while (lVar8 != 0) {
        local_60.move.operation = VMA_DEFRAGMENTATION_MOVE_OPERATION_COPY;
        local_60.move.dstTmpAllocation = (VmaAllocation)0x0;
        iVar6 = (*pVVar2->_vptr_VmaBlockMetadata[10])(pVVar2,lVar8);
        local_60.move.srcAllocation = (VmaAllocation)CONCAT44(extraout_var_00,iVar6);
        local_60.size = (local_60.move.srcAllocation)->m_Size;
        local_60.alignment = (local_60.move.srcAllocation)->m_Alignment;
        bVar4 = (local_60.move.srcAllocation)->m_SuballocationType;
        local_60.type = (VmaSuballocationType)bVar4;
        VVar13 = ((local_60.move.srcAllocation)->m_Flags & 1) * 4;
        local_60.flags = VVar13 + 0xc00;
        if (((local_60.move.srcAllocation)->m_Flags & 2) == 0) {
          local_60.flags = VVar13;
        }
        if ((VmaDefragmentationContext_T *)(local_60.move.srcAllocation)->m_pUserData == this)
        goto LAB_001be2ce;
        uVar12 = local_60.size + (this->m_PassStats).bytesMoved;
        uVar3 = this->m_MaxPassBytes;
        if (uVar3 < uVar12) {
          bVar4 = this->m_IgnoredAllocs + 1;
          this->m_IgnoredAllocs = bVar4;
          if (0xf < bVar4) {
            return uVar3 < uVar12;
          }
          goto LAB_001be2ce;
        }
        VVar11 = currentType;
        if ((int)local_60.type < (int)currentType) {
          VVar11 = (uint)bVar4;
        }
        VVar7 = currentType;
        if ((int)currentType < (int)local_60.type) {
          VVar7 = (uint)bVar4;
        }
        switch(VVar11) {
        case VMA_SUBALLOCATION_TYPE_FREE:
        case VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL:
switchD_001be1ff_caseD_0:
          bVar5 = AllocInOtherBlock(this,firstFreeBlock,(vector->m_Blocks).m_Count,&local_60,vector)
          ;
          if (bVar5) {
            return uVar3 < uVar12;
          }
          break;
        case VMA_SUBALLOCATION_TYPE_BUFFER:
          if (VVar7 != VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN) goto switchD_001be1ff_caseD_4;
          break;
        case VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN:
          if (2 < VVar7 - VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN) goto switchD_001be1ff_caseD_0;
          break;
        case VMA_SUBALLOCATION_TYPE_IMAGE_LINEAR:
switchD_001be1ff_caseD_4:
          if (VVar7 != VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL) goto switchD_001be1ff_caseD_0;
        }
        VVar11 = VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL;
        if ((int)local_60.type < 5) {
          VVar11 = local_60.type;
        }
        pbVar9 = texturePresent;
        switch(VVar11) {
        case VMA_SUBALLOCATION_TYPE_FREE:
        case VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL:
          break;
        default:
          goto switchD_001be261_caseD_1;
        case VMA_SUBALLOCATION_TYPE_BUFFER:
          goto joined_r0x001be28e;
        case VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN:
          VVar11 = VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL;
          if (5 < (int)local_60.type) {
            VVar11 = local_60.type;
          }
          if (VVar11 - VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN < 3) goto switchD_001be261_caseD_1;
          break;
        case VMA_SUBALLOCATION_TYPE_IMAGE_LINEAR:
joined_r0x001be28e:
          if ((int)local_60.type < 6) {
switchD_001be261_caseD_1:
            VVar11 = VMA_SUBALLOCATION_TYPE_BUFFER;
            if ((int)local_60.type < 2) {
              VVar11 = local_60.type;
            }
            pbVar9 = bufferPresent;
            if (VVar11 != VMA_SUBALLOCATION_TYPE_FREE) {
              if (VVar11 == VMA_SUBALLOCATION_TYPE_BUFFER) {
                VVar11 = local_60.type;
                if ((int)local_60.type < 3) {
                  VVar11 = VMA_SUBALLOCATION_TYPE_BUFFER;
                }
                if ((VVar11 != VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL) &&
                   (pbVar9 = bufferPresent, VVar11 != VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN)) break;
              }
              pbVar9 = otherPresent;
            }
          }
        }
        *pbVar9 = true;
LAB_001be2ce:
        iVar6 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,lVar8);
        lVar8 = CONCAT44(extraout_var_01,iVar6);
      }
      sVar14 = sVar14 - 1;
    } while (sVar14 != 0);
    sVar10 = (this->m_Moves).m_Count;
  }
  return sVar1 == sVar10;
}

Assistant:

bool VmaDefragmentationContext_T::MoveDataToFreeBlocks(VmaSuballocationType currentType, 
    VmaBlockVector& vector, size_t firstFreeBlock,
    bool& texturePresent, bool& bufferPresent, bool& otherPresent)
{
    const size_t prevMoveCount = m_Moves.size();
    for (size_t i = firstFreeBlock ; i;)
    {
        VmaDeviceMemoryBlock* block = vector.GetBlock(--i);
        VmaBlockMetadata* metadata = block->m_pMetadata;

        for (VmaAllocHandle handle = metadata->GetAllocationListBegin();
            handle != VK_NULL_HANDLE;
            handle = metadata->GetNextAllocation(handle))
        {
            MoveAllocationData moveData = GetMoveData(handle, metadata);
            // Ignore newly created allocations by defragmentation algorithm
            if (moveData.move.srcAllocation->GetUserData() == this)
                continue;
            switch (CheckCounters(moveData.move.srcAllocation->GetSize()))
            {
            case CounterStatus::Ignore:
                continue;
            case CounterStatus::End:
                return true;
            default:
                VMA_ASSERT(0);
            case CounterStatus::Pass:
                break;
            }

            // Move only single type of resources at once
            if (!VmaIsBufferImageGranularityConflict(moveData.type, currentType))
            {
                // Try to fit allocation into free blocks
                if (AllocInOtherBlock(firstFreeBlock, vector.GetBlockCount(), moveData, vector))
                    return false;
            }

            if (!VmaIsBufferImageGranularityConflict(moveData.type, VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL))
                texturePresent = true;
            else if (!VmaIsBufferImageGranularityConflict(moveData.type, VMA_SUBALLOCATION_TYPE_BUFFER))
                bufferPresent = true;
            else
                otherPresent = true;
        }
    }
    return prevMoveCount == m_Moves.size();
}